

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_iquot(LispPTR tosm1,LispPTR tos)

{
  ushort uVar1;
  uint uVar2;
  LispPTR *pLVar3;
  float *pfVar4;
  uint *NAddr;
  LispPTR LVar5;
  LispPTR LVar6;
  
  if ((tosm1 & 0xfff0000) != 0xf0000) {
    if ((tosm1 & 0xfff0000) == 0xe0000) {
      LVar6 = tosm1 & 0xffff;
      goto LAB_00107758;
    }
    uVar1 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar4 = (float *)NativeAligned4FromLAddr(tosm1);
      if (*pfVar4 == 2.1474836e+09) {
        LVar6 = (LispPTR)*pfVar4;
        goto LAB_00107758;
      }
    }
    else if (uVar1 == 2) {
      pLVar3 = NativeAligned4FromLAddr(tosm1);
      LVar6 = *pLVar3;
      goto LAB_00107758;
    }
    goto LAB_001077ed;
  }
  LVar6 = tosm1 | 0xffff0000;
LAB_00107758:
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar5 = tos | 0xffff0000;
LAB_001077cf:
    uVar2 = (uint)((long)(int)LVar6 / (long)(int)LVar5);
    if ((uVar2 & 0xffff0000) == 0xffff0000) {
      LVar6 = uVar2 & 0xffff | 0xf0000;
    }
    else {
      if (((long)(int)LVar6 / (long)(int)LVar5 & 0xffff0000U) != 0) {
        NAddr = (uint *)createcell68k(2);
        *NAddr = uVar2;
        LVar6 = LAddrFromNative(NAddr);
        return LVar6;
      }
      LVar6 = uVar2 | 0xe0000;
    }
  }
  else {
    if ((tos & 0xfff0000) == 0xe0000) {
      LVar5 = tos & 0xffff;
LAB_001077cb:
      if (LVar5 != 0) goto LAB_001077cf;
    }
    else {
      uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar1 == 3) {
        pfVar4 = (float *)NativeAligned4FromLAddr(tos);
        if (*pfVar4 == 2.1474836e+09) {
          LVar5 = (LispPTR)*pfVar4;
          goto LAB_001077cb;
        }
      }
      else if (uVar1 == 2) {
        pLVar3 = NativeAligned4FromLAddr(tos);
        LVar5 = *pLVar3;
        goto LAB_001077cb;
      }
    }
LAB_001077ed:
    MachineState.errorexit = 1;
    LVar6 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return LVar6;
}

Assistant:

LispPTR N_OP_iquot(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn;

  result = arg1 / arg2;
  N_ARITH_SWITCH(result);

doufn:
  ERROR_EXIT(tos);

}